

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

cbtMatrix3x3 * operator*(cbtMatrix3x3 *__return_storage_ptr__,cbtMatrix3x3 *m1,cbtMatrix3x3 *m2)

{
  cbtVector3 *pcVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  
  cVar2 = cbtMatrix3x3::tdotx(m2,m1->m_el);
  cVar3 = cbtMatrix3x3::tdoty(m2,m1->m_el);
  cVar4 = cbtMatrix3x3::tdotz(m2,m1->m_el);
  pcVar1 = m1->m_el + 1;
  cVar5 = cbtMatrix3x3::tdotx(m2,pcVar1);
  cVar6 = cbtMatrix3x3::tdoty(m2,pcVar1);
  cVar7 = cbtMatrix3x3::tdotz(m2,pcVar1);
  pcVar1 = m1->m_el + 2;
  cVar8 = cbtMatrix3x3::tdotx(m2,pcVar1);
  cVar9 = cbtMatrix3x3::tdoty(m2,pcVar1);
  cVar10 = cbtMatrix3x3::tdotz(m2,pcVar1);
  __return_storage_ptr__->m_el[0].m_floats[0] = cVar2;
  __return_storage_ptr__->m_el[0].m_floats[1] = cVar3;
  __return_storage_ptr__->m_el[0].m_floats[2] = cVar4;
  __return_storage_ptr__->m_el[0].m_floats[3] = 0.0;
  __return_storage_ptr__->m_el[1].m_floats[0] = cVar5;
  __return_storage_ptr__->m_el[1].m_floats[1] = cVar6;
  __return_storage_ptr__->m_el[1].m_floats[2] = cVar7;
  __return_storage_ptr__->m_el[1].m_floats[3] = 0.0;
  __return_storage_ptr__->m_el[2].m_floats[0] = cVar8;
  __return_storage_ptr__->m_el[2].m_floats[1] = cVar9;
  __return_storage_ptr__->m_el[2].m_floats[2] = cVar10;
  __return_storage_ptr__->m_el[2].m_floats[3] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

SIMD_FORCE_INLINE cbtMatrix3x3
operator*(const cbtMatrix3x3& m1, const cbtMatrix3x3& m2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))

	__m128 m10 = m1[0].mVec128;
	__m128 m11 = m1[1].mVec128;
	__m128 m12 = m1[2].mVec128;

	__m128 m2v = _mm_and_ps(m2[0].mVec128, btvFFF0fMask);

	__m128 c0 = bt_splat_ps(m10, 0);
	__m128 c1 = bt_splat_ps(m11, 0);
	__m128 c2 = bt_splat_ps(m12, 0);

	c0 = _mm_mul_ps(c0, m2v);
	c1 = _mm_mul_ps(c1, m2v);
	c2 = _mm_mul_ps(c2, m2v);

	m2v = _mm_and_ps(m2[1].mVec128, btvFFF0fMask);

	__m128 c0_1 = bt_splat_ps(m10, 1);
	__m128 c1_1 = bt_splat_ps(m11, 1);
	__m128 c2_1 = bt_splat_ps(m12, 1);

	c0_1 = _mm_mul_ps(c0_1, m2v);
	c1_1 = _mm_mul_ps(c1_1, m2v);
	c2_1 = _mm_mul_ps(c2_1, m2v);

	m2v = _mm_and_ps(m2[2].mVec128, btvFFF0fMask);

	c0 = _mm_add_ps(c0, c0_1);
	c1 = _mm_add_ps(c1, c1_1);
	c2 = _mm_add_ps(c2, c2_1);

	m10 = bt_splat_ps(m10, 2);
	m11 = bt_splat_ps(m11, 2);
	m12 = bt_splat_ps(m12, 2);

	m10 = _mm_mul_ps(m10, m2v);
	m11 = _mm_mul_ps(m11, m2v);
	m12 = _mm_mul_ps(m12, m2v);

	c0 = _mm_add_ps(c0, m10);
	c1 = _mm_add_ps(c1, m11);
	c2 = _mm_add_ps(c2, m12);

	return cbtMatrix3x3(c0, c1, c2);

#elif defined(BT_USE_NEON)

	float32x4_t rv0, rv1, rv2;
	float32x4_t v0, v1, v2;
	float32x4_t mv0, mv1, mv2;

	v0 = m1[0].mVec128;
	v1 = m1[1].mVec128;
	v2 = m1[2].mVec128;

	mv0 = (float32x4_t)vandq_s32((int32x4_t)m2[0].mVec128, btvFFF0Mask);
	mv1 = (float32x4_t)vandq_s32((int32x4_t)m2[1].mVec128, btvFFF0Mask);
	mv2 = (float32x4_t)vandq_s32((int32x4_t)m2[2].mVec128, btvFFF0Mask);

	rv0 = vmulq_lane_f32(mv0, vget_low_f32(v0), 0);
	rv1 = vmulq_lane_f32(mv0, vget_low_f32(v1), 0);
	rv2 = vmulq_lane_f32(mv0, vget_low_f32(v2), 0);

	rv0 = vmlaq_lane_f32(rv0, mv1, vget_low_f32(v0), 1);
	rv1 = vmlaq_lane_f32(rv1, mv1, vget_low_f32(v1), 1);
	rv2 = vmlaq_lane_f32(rv2, mv1, vget_low_f32(v2), 1);

	rv0 = vmlaq_lane_f32(rv0, mv2, vget_high_f32(v0), 0);
	rv1 = vmlaq_lane_f32(rv1, mv2, vget_high_f32(v1), 0);
	rv2 = vmlaq_lane_f32(rv2, mv2, vget_high_f32(v2), 0);

	return cbtMatrix3x3(rv0, rv1, rv2);

#else
	return cbtMatrix3x3(
		m2.tdotx(m1[0]), m2.tdoty(m1[0]), m2.tdotz(m1[0]),
		m2.tdotx(m1[1]), m2.tdoty(m1[1]), m2.tdotz(m1[1]),
		m2.tdotx(m1[2]), m2.tdoty(m1[2]), m2.tdotz(m1[2]));
#endif
}